

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O0

sexp sexp_register_simple_type_op(sexp ctx,sexp self,sexp_sint_t n,sexp name,sexp parent,sexp slots)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  short sVar4;
  sexp psVar5;
  sexp psVar6;
  sexp in_RCX;
  sexp in_RDX;
  sexp unaff_RBX;
  sexp in_RSI;
  sexp in_RDI;
  sexp in_R8;
  sexp in_R9;
  sexp unaff_R14;
  sexp unaff_R15;
  sexp unaff_retaddr;
  sexp in_stack_00000008;
  sexp in_stack_00000010;
  sexp in_stack_00000018;
  char *in_stack_00000020;
  sexp_proc2 in_stack_00000028;
  sexp tmp;
  sexp cpl;
  sexp num_slots_obj;
  sexp type_size;
  short num_slots;
  short i;
  sexp in_stack_ffffffffffffff88;
  sexp in_stack_ffffffffffffff90;
  sexp in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffb0;
  short in_stack_ffffffffffffffb6;
  
  psVar5 = sexp_length_op(in_RDI,(sexp)0x0,1,in_R9);
  auVar1._8_8_ = (long)psVar5 >> 0x3f;
  auVar1._0_8_ = (ulong)psVar5 & 0xfffffffffffffffe;
  sVar4 = SUB162(auVar1 / SEXT816(2),0);
  if (((in_R8 != (sexp)0x0) && (((ulong)in_R8 & 3) == 0)) && (in_R8->tag == 1)) {
    psVar5 = sexp_length_op(in_RDI,(sexp)0x0,1,(in_R8->value).type.slots);
    auVar2._8_8_ = (long)psVar5 >> 0x3f;
    auVar2._0_8_ = (ulong)psVar5 & 0xfffffffffffffffe;
    sVar4 = sVar4 + SUB162(auVar2 / SEXT816(2),0);
    in_stack_ffffffffffffff98 = (in_R8->value).type.cpl;
    if ((((ulong)in_stack_ffffffffffffff98 & 3) == 0) &&
       (in_stack_ffffffffffffff98 = (in_R8->value).type.cpl, in_stack_ffffffffffffff98->tag == 10))
    {
      in_stack_ffffffffffffffb6 = (short)(in_stack_ffffffffffffff98->value).vector.length;
      while (in_stack_ffffffffffffffb6 = in_stack_ffffffffffffffb6 + -1,
            -1 < in_stack_ffffffffffffffb6) {
        in_stack_ffffffffffffff90 =
             *(sexp *)((long)&in_stack_ffffffffffffff98->value +
                      (((long)in_stack_ffffffffffffffb6 << 1) / 2) * 8 + 8);
        psVar5 = in_stack_ffffffffffffff98;
        psVar6 = sexp_length_op(in_RDI,(sexp)0x0,1,(in_stack_ffffffffffffff90->value).type.slots);
        auVar3._8_8_ = (long)psVar6 >> 0x3f;
        auVar3._0_8_ = (ulong)psVar6 & 0xfffffffffffffffe;
        sVar4 = sVar4 + SUB162(auVar3 / SEXT816(2),0);
        in_stack_ffffffffffffff88 = in_stack_ffffffffffffff98;
        in_stack_ffffffffffffff98 = psVar5;
      }
    }
  }
  psVar5 = sexp_register_type_op
                     (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                      (sexp_sint_t)in_stack_ffffffffffffff88,(sexp)0x0,(sexp)0x0,
                      (sexp)((((in_RDI->value).type.setters)->value).port.stream)->_freeres_list->
                            _IO_buf_base,
                      (sexp)CONCAT26(in_stack_ffffffffffffffb6,
                                     CONCAT24(sVar4,in_stack_ffffffffffffffb0)),in_R9,in_R8,in_RCX,
                      in_RDX,in_RSI,in_RDI,unaff_RBX,unaff_R14,unaff_R15,unaff_retaddr,
                      in_stack_00000008,in_stack_00000010,in_stack_00000018,in_stack_00000020,
                      in_stack_00000028);
  return psVar5;
}

Assistant:

sexp sexp_register_simple_type_op (sexp ctx, sexp self, sexp_sint_t n, sexp name, sexp parent, sexp slots) {
  short i, num_slots = (short)sexp_unbox_fixnum(sexp_length(ctx, slots));
  sexp type_size, num_slots_obj, cpl, tmp;
  if (parent && sexp_typep(parent)) {
    num_slots += (short)sexp_unbox_fixnum(sexp_length(ctx, sexp_type_slots(parent)));
    if (sexp_vectorp((cpl = sexp_type_cpl(parent))))
      for (i=(short)sexp_vector_length(cpl)-1; i>=0; i--) {
        tmp = sexp_vector_ref(cpl, sexp_make_fixnum(i));
        num_slots += (short)sexp_unbox_fixnum(sexp_length(ctx, sexp_type_slots(tmp)));
      }
  }
  num_slots_obj = sexp_make_fixnum(num_slots);
  type_size = sexp_make_fixnum(sexp_sizeof_header + sizeof(sexp)*num_slots);
  return
    sexp_register_type(ctx, name, parent, slots,
                       sexp_make_fixnum(sexp_offsetof_slot0),
                       num_slots_obj, num_slots_obj, SEXP_ZERO, SEXP_ZERO,
                       type_size, SEXP_ZERO, SEXP_ZERO, SEXP_ZERO, SEXP_ZERO,
                       SEXP_ZERO, SEXP_ZERO, SEXP_ZERO,
                       sexp_type_print(sexp_type_by_index(ctx, SEXP_EXCEPTION)),
                       NULL, NULL);
}